

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

unique_ptr<Lexer,_std::default_delete<Lexer>_>
createLexer(CommandLineParseResult *parseResult,Option *eval,Option *file)

{
  bool bVar1;
  byte bVar2;
  runtime_error *this;
  Option *in_RCX;
  unique_ptr<FileLexer,_std::default_delete<FileLexer>_> local_290;
  string local_288;
  undefined1 local_268 [8];
  ifstream stream;
  string local_50;
  undefined1 local_30 [16];
  Option *file_local;
  Option *eval_local;
  CommandLineParseResult *parseResult_local;
  
  local_30._8_8_ = in_RCX;
  file_local = file;
  eval_local = eval;
  parseResult_local = parseResult;
  bVar1 = CommandLineParseResult::hasOption((CommandLineParseResult *)eval,file);
  if (bVar1) {
    CommandLineParseResult::getValue_abi_cxx11_(&local_50,(CommandLineParseResult *)eval,file_local)
    ;
    std::make_unique<TextLexer,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    std::unique_ptr<Lexer,std::default_delete<Lexer>>::
    unique_ptr<TextLexer,std::default_delete<TextLexer>,void>
              ((unique_ptr<Lexer,std::default_delete<Lexer>> *)parseResult,
               (unique_ptr<TextLexer,_std::default_delete<TextLexer>_> *)local_30);
    std::unique_ptr<TextLexer,_std::default_delete<TextLexer>_>::~unique_ptr
              ((unique_ptr<TextLexer,_std::default_delete<TextLexer>_> *)local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    CommandLineParseResult::getValue_abi_cxx11_
              (&local_288,(CommandLineParseResult *)eval,(Option *)local_30._8_8_);
    std::ifstream::ifstream(local_268,(string *)&local_288,_S_in);
    std::__cxx11::string::~string((string *)&local_288);
    bVar2 = std::ios::good();
    if ((bVar2 & 1) == 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Invalid path");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::make_unique<FileLexer,std::ifstream>
              ((basic_ifstream<char,_std::char_traits<char>_> *)&local_290);
    std::unique_ptr<Lexer,std::default_delete<Lexer>>::
    unique_ptr<FileLexer,std::default_delete<FileLexer>,void>
              ((unique_ptr<Lexer,std::default_delete<Lexer>> *)parseResult,&local_290);
    std::unique_ptr<FileLexer,_std::default_delete<FileLexer>_>::~unique_ptr(&local_290);
    std::ifstream::~ifstream(local_268);
  }
  return (__uniq_ptr_data<Lexer,_std::default_delete<Lexer>,_true,_true>)
         (__uniq_ptr_data<Lexer,_std::default_delete<Lexer>,_true,_true>)parseResult;
}

Assistant:

auto createLexer(CommandLineParseResult parseResult, Option* eval, Option* file) -> std::unique_ptr<Lexer> {
    if (parseResult.hasOption(*eval)) {
        return std::make_unique<TextLexer>(parseResult.getValue(*eval));
    } else {
        auto stream = std::ifstream(parseResult.getValue(*file), std::ios::in);
        if (!stream.good())
            throw std::runtime_error("Invalid path");

        return std::make_unique<FileLexer>(std::move(stream));
    }
}